

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O0

char * supdup_init(BackendVtable *x,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  Supdup *supdup_00;
  Conf *pCVar4;
  char *pcVar5;
  SockAddr *addr_00;
  Socket *pSVar6;
  Pinger *pPVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  char *local_e8;
  int scrolling;
  int more_processing;
  int ascii_set;
  char *colon;
  char *buf;
  char *utf8;
  int addressfamily;
  char *loghost;
  Supdup *supdup;
  char *err;
  SockAddr *addr;
  _Bool keepalive_local;
  _Bool nodelay_local;
  char *host_local;
  Conf *conf_local;
  LogContext *logctx_local;
  Backend **backend_handle_local;
  Seat *seat_local;
  BackendVtable *x_local;
  
  supdup_00 = (Supdup *)safemalloc(1,0xc0,0);
  (supdup_00->interactor).parent = (Interactor *)0x0;
  (supdup_00->interactor).last_to_talk = (Interactor *)0x0;
  (supdup_00->backend).interactor = (Interactor *)0x0;
  (supdup_00->interactor).vt = (InteractorVtable *)0x0;
  (supdup_00->plug).vt = (PlugVtable *)0x0;
  (supdup_00->backend).vt = (BackendVtable *)0x0;
  supdup_00->print = (_func_void_strbuf_ptr_int *)0x0;
  supdup_00->pinger = (Pinger *)0x0;
  supdup_00->td_argcount = 0;
  supdup_00->td_args[0] = '\0';
  supdup_00->td_args[1] = '\0';
  supdup_00->td_args[2] = '\0';
  supdup_00->td_args[3] = '\0';
  *(undefined8 *)&supdup_00->td_argindex = 0;
  supdup_00->bufsize = 0;
  supdup_00->state = CONNECTING;
  supdup_00->tdstate = CONNECTING;
  supdup_00->td_code = 0;
  *(undefined8 *)&supdup_00->sent_location = 0;
  supdup_00->conf = (Conf *)0x0;
  supdup_00->tcmxv = 0;
  supdup_00->tcmxh = 0;
  supdup_00->description = (char *)0x0;
  supdup_00->ttyopt = 0;
  supdup_00->ldisc = (Ldisc *)0x0;
  supdup_00->term_width = 0;
  supdup_00->term_height = 0;
  supdup_00->seat = (Seat *)0x0;
  supdup_00->logctx = (LogContext *)0x0;
  supdup_00->s = (Socket *)0x0;
  supdup_00->socket_connected = false;
  supdup_00->closed_on_socket_error = false;
  *(undefined6 *)&supdup_00->field_0xa = 0;
  (supdup_00->plug).vt = &supdup_init::fn_table;
  (supdup_00->backend).vt = &supdup_backend;
  (supdup_00->interactor).vt = &Supdup_interactorvt;
  (supdup_00->backend).interactor = &supdup_00->interactor;
  supdup_00->logctx = logctx;
  pCVar4 = conf_copy(conf);
  supdup_00->conf = pCVar4;
  supdup_00->s = (Socket *)0x0;
  supdup_00->socket_connected = false;
  supdup_00->closed_on_socket_error = false;
  supdup_00->seat = seat;
  iVar3 = conf_get_int(supdup_00->conf,0x7d);
  supdup_00->term_width = iVar3;
  iVar3 = conf_get_int(supdup_00->conf,0x7e);
  supdup_00->term_height = iVar3;
  supdup_00->pinger = (Pinger *)0x0;
  supdup_00->sent_location = false;
  pcVar5 = default_description((supdup_00->backend).vt,host,port);
  supdup_00->description = pcVar5;
  *backend_handle = &supdup_00->backend;
  iVar3 = conf_get_int(supdup_00->conf,0x45);
  if (iVar3 == 0) {
    supdup_00->print = print_ascii;
  }
  else if (iVar3 == 1) {
    supdup_00->print = print_its;
  }
  else if (iVar3 == 2) {
    supdup_00->print = print_waits;
  }
  iVar3 = conf_get_int(supdup_00->conf,3);
  if (iVar3 == 1) {
    local_e8 = " (IPv4)";
  }
  else {
    local_e8 = anon_var_dwarf_248df + 10;
    if (iVar3 == 2) {
      local_e8 = " (IPv6)";
    }
  }
  pcVar5 = dupprintf("Looking up host \"%s\"%s",host,local_e8);
  logevent(supdup_00->logctx,pcVar5);
  safefree(pcVar5);
  addr_00 = name_lookup(host,port,realhost,supdup_00->conf,iVar3,(LogContext *)0x0,
                        anon_var_dwarf_248df + 10);
  pcVar5 = sk_addr_error(addr_00);
  if (pcVar5 == (char *)0x0) {
    if (port < 0) {
      port = 0x5f;
    }
    pSVar6 = new_connection(addr_00,*realhost,port,false,true,nodelay,keepalive,&supdup_00->plug,
                            supdup_00->conf,&supdup_00->interactor);
    supdup_00->s = pSVar6;
    pcVar5 = sk_socket_error(supdup_00->s);
    if (pcVar5 == (char *)0x0) {
      pPVar7 = pinger_new(supdup_00->conf,&supdup_00->backend);
      supdup_00->pinger = pPVar7;
      seat_update_specials_menu(supdup_00->seat);
      pcVar5 = conf_get_str(supdup_00->conf,9);
      if (*pcVar5 != '\0') {
        safefree(*realhost);
        pcVar5 = dupstr(pcVar5);
        *realhost = pcVar5;
        pcVar5 = host_strrchr(*realhost,0x3a);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
        }
      }
      iVar3 = conf_get_int(supdup_00->conf,0x45);
      _Var1 = conf_get_bool(supdup_00->conf,0x46);
      _Var2 = conf_get_bool(supdup_00->conf,0x47);
      uVar11 = 0x30000000;
      if (iVar3 == 0) {
        uVar11 = 0;
      }
      uVar8 = 0;
      if (_Var2) {
        uVar8 = 0x1000000;
      }
      uVar9 = 0;
      if (_Var1) {
        uVar9 = 0x2000000;
      }
      supdup_00->ttyopt = uVar11 | 0x1444c0020 | uVar8 | uVar9 | 8;
      supdup_00->tcmxh = (long)(supdup_00->term_width + -1);
      supdup_00->tcmxv = (long)supdup_00->term_height;
      supdup_send_config(supdup_00);
      supdup_00->state = CONNECTING;
      seat_set_trust_status(supdup_00->seat,false);
      sVar10 = strlen("\x1b%G");
      c_write(supdup_00,(uchar *)"\x1b%G",(int)sVar10);
      x_local = (BackendVtable *)0x0;
    }
    else {
      x_local = (BackendVtable *)dupstr(pcVar5);
    }
  }
  else {
    sk_addr_free(addr_00);
    x_local = (BackendVtable *)dupstr(pcVar5);
  }
  return (char *)x_local;
}

Assistant:

static char *supdup_init(const BackendVtable *x, Seat *seat,
                         Backend **backend_handle,
                         LogContext *logctx, Conf *conf,
                         const char *host, int port, char **realhost,
                         bool nodelay, bool keepalive)
{
    static const PlugVtable fn_table = {
        .log = supdup_log,
        .closing = supdup_closing,
        .receive = supdup_receive,
        .sent = supdup_sent,
    };
    SockAddr *addr;
    const char *err;
    Supdup *supdup;
    char *loghost;
    int addressfamily;
    const char *utf8 = "\033%G";

    supdup = snew(struct supdup_tag);
    memset(supdup, 0, sizeof(Supdup));
    supdup->plug.vt = &fn_table;
    supdup->backend.vt = &supdup_backend;
    supdup->interactor.vt = &Supdup_interactorvt;
    supdup->backend.interactor = &supdup->interactor;
    supdup->logctx = logctx;
    supdup->conf = conf_copy(conf);
    supdup->s = NULL;
    supdup->socket_connected = false;
    supdup->closed_on_socket_error = false;
    supdup->seat = seat;
    supdup->term_width = conf_get_int(supdup->conf, CONF_width);
    supdup->term_height = conf_get_int(supdup->conf, CONF_height);
    supdup->pinger = NULL;
    supdup->sent_location = false;
    supdup->description = default_description(supdup->backend.vt, host, port);
    *backend_handle = &supdup->backend;

    switch (conf_get_int(supdup->conf, CONF_supdup_ascii_set)) {
    case SUPDUP_CHARSET_ASCII:
      supdup->print = print_ascii;
      break;
    case SUPDUP_CHARSET_ITS:
      supdup->print = print_its;
      break;
    case SUPDUP_CHARSET_WAITS:
      supdup->print = print_waits;
      break;
    }

    /*
     * Try to find host.
     */
    {
        char *buf;
        addressfamily = conf_get_int(supdup->conf, CONF_addressfamily);
        buf = dupprintf("Looking up host \"%s\"%s", host,
                        (addressfamily == ADDRTYPE_IPV4 ? " (IPv4)" :
                         (addressfamily == ADDRTYPE_IPV6 ? " (IPv6)" :
                          "")));
        logevent(supdup->logctx, buf);
        sfree(buf);
    }
    addr = name_lookup(host, port, realhost, supdup->conf, addressfamily, NULL, "");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 0137;            /* default supdup port */

    /*
     * Open socket.
     */
    supdup->s = new_connection(addr, *realhost, port, false, true,
                               nodelay, keepalive, &supdup->plug, supdup->conf,
                               &supdup->interactor);
    if ((err = sk_socket_error(supdup->s)) != NULL)
        return dupstr(err);

    supdup->pinger = pinger_new(supdup->conf, &supdup->backend);

    /*
     * We can send special commands from the start.
     */
    seat_update_specials_menu(supdup->seat);

    /*
     * loghost overrides realhost, if specified.
     */
    loghost = conf_get_str(supdup->conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    /*
     * Set up TTYOPTS based on config
     */
    int ascii_set = conf_get_int(supdup->conf, CONF_supdup_ascii_set);
    int more_processing = conf_get_bool(supdup->conf, CONF_supdup_more);
    int scrolling = conf_get_bool(supdup->conf, CONF_supdup_scroll);
    supdup->ttyopt =
        TOERS |
        TOMVB |
        (ascii_set == SUPDUP_CHARSET_ASCII ? 0 : TOSAI | TOSA1) |
        TOMVU |
        TOLWR |
        TOLID |
        TOCID |
        TPCBS |
        (scrolling ? TOROL : 0) |
        (more_processing ? TOMOR : 0) |
        TPORS;

    supdup->tcmxh = supdup->term_width - 1;             // -1 "..one column is used to indicate line continuation."
    supdup->tcmxv = supdup->term_height;

    /*
     * Send our configuration words to the server
     */
    supdup_send_config(supdup);

    /*
     * We next expect a connection message followed by %TDNOP from the server
     */
    supdup->state = CONNECTING;
    seat_set_trust_status(supdup->seat, false);

    /* Make sure the terminal is in UTF-8 mode. */
    c_write(supdup, (unsigned char *)utf8, strlen(utf8));

    return NULL;
}